

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::WarningsAsErrorsTest(void)

{
  bool bVar1;
  IDLOptions opts;
  Parser parser;
  
  IDLOptions::IDLOptions(&opts);
  Parser::Parser(&parser,&opts);
  bVar1 = Parser::Parse(&parser,"table T { THIS_NAME_CAUSES_A_WARNING:string;}\nroot_type T;",
                        (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table T { THIS_NAME_CAUSES_A_WARNING:string;}\\n\" \"root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x36c,"");
  Parser::~Parser(&parser);
  IDLOptions::~IDLOptions(&opts);
  IDLOptions::IDLOptions(&opts);
  opts.warnings_as_errors = true;
  Parser::Parser(&parser,&opts);
  bVar1 = Parser::Parse(&parser,"table T { THIS_NAME_CAUSES_A_WARNING:string;}\nroot_type T;",
                        (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,false,
                    "\'parser.Parse(\"table T { THIS_NAME_CAUSES_A_WARNING:string;}\\n\" \"root_type T;\")\' != \'false\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x374,"");
  Parser::~Parser(&parser);
  IDLOptions::~IDLOptions(&opts);
  return;
}

Assistant:

void WarningsAsErrorsTest() {
  {
    flatbuffers::IDLOptions opts;
    // opts.warnings_as_errors should default to false
    flatbuffers::Parser parser(opts);
    TEST_EQ(parser.Parse("table T { THIS_NAME_CAUSES_A_WARNING:string;}\n"
                         "root_type T;"),
            true);
  }
  {
    flatbuffers::IDLOptions opts;
    opts.warnings_as_errors = true;
    flatbuffers::Parser parser(opts);
    TEST_EQ(parser.Parse("table T { THIS_NAME_CAUSES_A_WARNING:string;}\n"
                         "root_type T;"),
            false);
  }
}